

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_core.cpp
# Opt level: O0

void r_exec::delegatedCoreWait(TimeJob *job)

{
  uint64_t uVar1;
  thread *this;
  int iVar2;
  State SVar3;
  uint uVar4;
  _Mem *p_Var5;
  __int_type _Var6;
  byte local_59;
  long local_50;
  int64_t lag;
  duration<long,_std::ratio<1L,_1000000L>_> local_30;
  duration local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  byte local_11;
  TimeJob *pTStack_10;
  bool run;
  TimeJob *job_local;
  
  pTStack_10 = job;
  p_Var5 = _Mem::Get();
  _Mem::start_core(p_Var5);
  local_11 = 1;
  do {
    if (pTStack_10->target_time != 0) {
      uVar1 = pTStack_10->target_time;
      _Var6 = std::__atomic_base::operator_cast_to_long
                        ((__atomic_base *)&delegatedCoreWait::last_lag);
      lag = uVar1 - _Var6;
      std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<unsigned_long,void>
                ((duration<long,std::ratio<1l,1000000l>> *)&local_30,(unsigned_long *)&lag);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000000l>,void>
                ((duration<long,std::ratio<1l,1000000000l>> *)&local_28,&local_30);
      std::chrono::
      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point(&local_20,&local_28);
      std::this_thread::
      sleep_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                (&local_20);
    }
    iVar2 = (*(pTStack_10->super__Object)._vptr__Object[3])();
    if ((((byte)iVar2 ^ 0xff) & 1) != 0) break;
    p_Var5 = _Mem::Get();
    SVar3 = _Mem::check_state(p_Var5);
    if (SVar3 != RUNNING) break;
    if (pTStack_10->target_time == 0) {
      local_50 = 0;
    }
    else {
      local_50 = (*Now)();
      local_50 = local_50 - pTStack_10->target_time;
    }
    iVar2 = (*(pTStack_10->super__Object)._vptr__Object[2])();
    local_11 = (byte)iVar2 & 1;
    (*(pTStack_10->super__Object)._vptr__Object[5])(pTStack_10,local_50);
    _Var6 = std::__atomic_base::operator_cast_to_long((__atomic_base *)&delegatedCoreWait::last_lag)
    ;
    std::__atomic_base<long>::operator=
              (&delegatedCoreWait::last_lag.super___atomic_base<long>,
               (long)((double)_Var6 * 0.8999999985098839 + (double)((float)local_50 * 0.1)));
    uVar4 = (*(pTStack_10->super__Object)._vptr__Object[4])();
    local_59 = 0;
    if ((uVar4 & 1) != 0) {
      local_59 = local_11;
    }
  } while ((local_59 & 1) != 0);
  this = pTStack_10->thread;
  if (this != (thread *)0x0) {
    std::thread::~thread(this);
    operator_delete(this);
  }
  if (pTStack_10 != (TimeJob *)0x0) {
    (*(pTStack_10->super__Object)._vptr__Object[1])();
  }
  p_Var5 = _Mem::Get();
  _Mem::shutdown_core(p_Var5);
  return;
}

Assistant:

void delegatedCoreWait(TimeJob *job)
{
    _Mem::Get()->start_core();
    bool run = true;

    static std::atomic_int64_t last_lag;

    static constexpr float smoothing_factor = 0.1;

    do {
        if (job->target_time > 0) {
            std::this_thread::sleep_until(high_resolution_clock::time_point(microseconds(job->target_time - last_lag)));
        }

        if (R_UNLIKELY(!job->is_alive())) {
            break;
        }

        if (R_UNLIKELY(_Mem::Get()->check_state() != _Mem::RUNNING)) {
            break;
        }

        int64_t lag = job->target_time ? Now() - job->target_time : 0;
        run = job->update();

        job->report(lag);

        last_lag = smoothing_factor * lag + (1.0 - smoothing_factor) * last_lag;
    } while(job->shouldRunAgain() && run);

    delete job->thread;
    delete job;
    _Mem::Get()->shutdown_core();
}